

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall fmt::v11::basic_specs::set_fill<char>(basic_specs *this,basic_string_view<char> s)

{
  size_t size_00;
  char *pcVar1;
  size_t local_38;
  size_t i;
  uint uchar;
  size_t size;
  basic_specs *this_local;
  basic_string_view<char> s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (basic_specs *)s.data_;
  size_00 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  set_fill_size(this,size_00);
  if (size_00 == 1) {
    pcVar1 = basic_string_view<char>::operator[]((basic_string_view<char> *)&this_local,0);
    this->fill_data_[0] = *pcVar1;
    this->fill_data_[1] = '\0';
    this->fill_data_[2] = '\0';
  }
  else {
    if (4 < size_00) {
      detail::assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/base.h"
                          ,0x34c,"invalid fill");
    }
    for (local_38 = 0; local_38 < size_00; local_38 = local_38 + 1) {
      pcVar1 = basic_string_view<char>::operator[]((basic_string_view<char> *)&this_local,local_38);
      this->fill_data_[local_38 & 3] = *pcVar1;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void set_fill(basic_string_view<Char> s) {
    auto size = s.size();
    set_fill_size(size);
    if (size == 1) {
      unsigned uchar = static_cast<detail::unsigned_char<Char>>(s[0]);
      fill_data_[0] = static_cast<char>(uchar);
      fill_data_[1] = static_cast<char>(uchar >> 8);
      fill_data_[2] = static_cast<char>(uchar >> 16);
      return;
    }
    FMT_ASSERT(size <= max_fill_size, "invalid fill");
    for (size_t i = 0; i < size; ++i)
      fill_data_[i & 3] = static_cast<char>(s[i]);
  }